

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<wasm::SmallVector<wasm::Expression*,1ul>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          SmallVector<wasm::Expression_*,_1UL> *list)

{
  bool bVar1;
  size_t size_00;
  value_type *ppEVar2;
  value_type elem;
  ConstIterator __end0;
  ConstIterator __begin0;
  SmallVector<wasm::Expression_*,_1UL> *__range2;
  size_t i;
  size_t size;
  SmallVector<wasm::Expression_*,_1UL> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  size_00 = ::wasm::SmallVector<wasm::Expression_*,_1UL>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size_00);
  }
  __range2 = (SmallVector<wasm::Expression_*,_1UL> *)0x0;
  join_0x00000010_0x00000000_ =
       (IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
        )::wasm::SmallVector<wasm::Expression_*,_1UL>::begin(list);
  _elem = (IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
           )::wasm::SmallVector<wasm::Expression_*,_1UL>::end(list);
  while( true ) {
    bVar1 = ::wasm::SmallVector<wasm::Expression_*,_1UL>::
            IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
            ::operator!=((IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
                          *)&__end0.
                             super_IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
                             .index,(ConstIterator *)&elem);
    if (!bVar1) break;
    ppEVar2 = ::wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator::operator*
                        ((ConstIterator *)
                         &__end0.
                          super_IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
                          .index);
    *(value_type *)(*(long *)this + (long)__range2 * 8) = *ppEVar2;
    ::wasm::SmallVector<wasm::Expression_*,_1UL>::
    IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
    ::operator++((IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
                  *)&__end0.
                     super_IteratorBase<const_wasm::SmallVector<wasm::Expression_*,_1UL>,_wasm::SmallVector<wasm::Expression_*,_1UL>::ConstIterator>
                     .index);
    __range2 = (SmallVector<wasm::Expression_*,_1UL> *)((long)&__range2->usedFixed + 1);
  }
  *(size_t *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }